

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlCheckOutputSavePattern(Fra_Man_t *p,Aig_Obj_t *pObjPo)

{
  Fra_Sml_t *pFVar1;
  Vec_Ptr_t *p_00;
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  pFVar1 = p->pSml;
  uVar5 = pFVar1->nWordsTotal;
  lVar6 = (long)(int)(*(int *)(((ulong)pObjPo->pFanin0 & 0xfffffffffffffffe) + 0x24) * uVar5) * 4;
  uVar7 = 0;
  uVar2 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar2 = uVar7;
  }
  while( true ) {
    if (uVar2 == uVar7) {
      __assert_fail("i < p->pSml->nWordsTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x124,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
    }
    if (*(int *)((long)&pFVar1[1].pAig + uVar7 * 4 + lVar6) != 0) break;
    uVar7 = uVar7 + 1;
  }
  uVar5 = 0;
  while( true ) {
    if (uVar5 == 0x20) {
      __assert_fail("k < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x129,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
    }
    if ((*(uint *)((long)&pFVar1[1].pAig + uVar7 * 4 + lVar6) >> (uVar5 & 0x1f) & 1) != 0) break;
    uVar5 = uVar5 + 1;
  }
  pvVar3 = malloc((long)p->pManFraig->nObjs[2] * 4 + 4);
  lVar6 = 0;
  while( true ) {
    p_00 = p->pManAig->vCis;
    if (p_00->nSize <= lVar6) break;
    pvVar4 = Vec_PtrEntry(p_00,(int)lVar6);
    *(uint *)((long)pvVar3 + lVar6 * 4) =
         (uint)((*(uint *)((long)&p->pSml[1].pAig +
                          uVar7 * 4 +
                          (long)p->pSml->nWordsTotal * (long)*(int *)((long)pvVar4 + 0x24) * 4) >>
                 (uVar5 & 0x1f) & 1) != 0);
    lVar6 = lVar6 + 1;
  }
  *(int *)((long)pvVar3 + (long)p->pManAig->nObjs[2] * 4) = pObjPo->Id;
  if (p->pManFraig->pData == (void *)0x0) {
    p->pManFraig->pData = pvVar3;
    return;
  }
  __assert_fail("p->pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x136,"void Fra_SmlCheckOutputSavePattern(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Fra_SmlCheckOutputSavePattern( Fra_Man_t * p, Aig_Obj_t * pObjPo )
{ 
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Fra_ObjSim(p->pSml, pFanin->Id);
    for ( i = 0; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->pSml->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pManFraig)+1 );
    Aig_ManForEachCi( p->pManAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Fra_ObjSim(p->pSml, pObjPi->Id), BestPat);
//        printf( "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pManAig)] = pObjPo->Id;
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}